

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O1

Vector2 Vector2MoveTowards(Vector2 v,Vector2 target,float maxDistance)

{
  Vector2 VVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  
  fVar3 = target.x - v.x;
  fVar4 = target.y - v.y;
  fVar2 = fVar3 * fVar3 + fVar4 * fVar4;
  if (fVar2 < 0.0) {
    fVar2 = sqrtf(fVar2);
  }
  else {
    fVar2 = SQRT(fVar2);
  }
  VVar1.y = (fVar4 / fVar2) * maxDistance + v.y;
  VVar1.x = (fVar3 / fVar2) * maxDistance + v.x;
  return VVar1;
}

Assistant:

RMDEF Vector2 Vector2MoveTowards(Vector2 v, Vector2 target, float maxDistance)
{
    Vector2 result = { 0 };
    float dx = target.x - v.x;
    float dy = target.y - v.y;
    float value = (dx*dx) + (dy*dy);

    if ((value == 0) || ((maxDistance >= 0) && (value <= maxDistance*maxDistance))) result = target;

    float dist = sqrtf(value);

    result.x = v.x + dx/dist*maxDistance;
    result.y = v.y + dy/dist*maxDistance;

    return result;
}